

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O2

void __thiscall
sptk::reaper::FdFilter::RationalApproximation(FdFilter *this,float a,int *k,int *l,int qlim)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar3 = (float)(int)ABS(a);
  fVar4 = 0.0;
  fVar5 = 1.0;
  fVar8 = 1.0;
  fVar6 = 1.0;
  while (fVar7 = fVar8, fVar4 = fVar4 + 1.0, fVar4 <= (float)qlim) {
    fVar8 = (ABS(a) - fVar3) * fVar4;
    fVar9 = (float)(int)(fVar8 + 0.5);
    fVar8 = ABS((fVar8 - fVar9) / fVar4);
    fVar10 = fVar4;
    if (fVar7 <= fVar8) {
      fVar10 = fVar6;
    }
    fVar5 = (float)(~-(uint)(fVar8 < fVar7) & (uint)fVar5 | (uint)fVar9 & -(uint)(fVar8 < fVar7));
    fVar6 = fVar10;
    if (fVar7 <= fVar8) {
      fVar8 = fVar7;
    }
  }
  iVar1 = (int)(fVar3 * fVar6 + fVar5);
  iVar2 = -iVar1;
  if (0.0 < a) {
    iVar2 = iVar1;
  }
  *k = iVar2;
  *l = (int)fVar6;
  return;
}

Assistant:

void FdFilter::RationalApproximation(float a, int *k, int *l, int qlim) {
  float aa, af, q, em, qq = 1.0, pp = 1.0, ps, e;
  int ai, ip, i;

  aa = fabs(a);
  ai = static_cast<int>(aa);
  i = ai;
  af = aa - i;
  q = 0;
  em = 1.0;
  while (++q <= qlim) {
    ps = q * af;
    ip = static_cast<int>(ps + 0.5);
    e = fabs((ps - static_cast<float>(ip)) / q);
    if (e < em) {
      em = e;
      pp = ip;
      qq = q;
    }
  }
  *k = static_cast<int>((ai * qq) + pp);
  *k = (a > 0)? *k : -(*k);
  *l = static_cast<int>(qq);
}